

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeoffsets.cpp
# Opt level: O1

seconds __thiscall TimeOffsets::Median(TimeOffsets *this)

{
  _Map_pointer ppdVar1;
  long lVar2;
  _Elt_pointer pdVar3;
  _Elt_pointer pdVar4;
  _Elt_pointer pdVar5;
  _Elt_pointer pdVar6;
  _Elt_pointer pdVar7;
  _Map_pointer ppdVar8;
  ulong uVar9;
  rep rVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  deque<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  sorted_copy;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock1;
  _Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  local_118;
  _Elt_pointer local_c8;
  _Elt_pointer local_c0;
  _Elt_pointer local_b8;
  _Map_pointer local_b0;
  _Elt_pointer local_a8;
  _Elt_pointer local_a0;
  _Elt_pointer local_98;
  _Map_pointer local_90;
  _Elt_pointer local_88;
  _Elt_pointer local_80;
  _Elt_pointer local_78;
  _Map_pointer local_70;
  _Elt_pointer local_68;
  _Elt_pointer local_60;
  _Elt_pointer local_58;
  _Map_pointer local_50;
  unique_lock<std::mutex> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._M_owns = false;
  local_48._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_48);
  ppdVar1 = (this->m_offsets).
            super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  if (((long)(this->m_offsets).
             super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last -
       (long)(this->m_offsets).
             super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
      ((long)(this->m_offsets).
             super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur -
       (long)(this->m_offsets).
             super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
      ((((ulong)((long)ppdVar1 -
                (long)(this->m_offsets).
                      super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
      (ulong)(ppdVar1 == (_Map_pointer)0x0)) * 0x40 < 5) {
    rVar10 = 0;
  }
  else {
    std::
    deque<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::deque((deque<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
             *)&local_118,&this->m_offsets);
    ppdVar8 = local_118._M_impl.super__Deque_impl_data._M_finish._M_node;
    pdVar7 = local_118._M_impl.super__Deque_impl_data._M_finish._M_first;
    pdVar6 = local_118._M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppdVar1 = local_118._M_impl.super__Deque_impl_data._M_start._M_node;
    pdVar5 = local_118._M_impl.super__Deque_impl_data._M_start._M_last;
    pdVar4 = local_118._M_impl.super__Deque_impl_data._M_start._M_first;
    pdVar3 = local_118._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (local_118._M_impl.super__Deque_impl_data._M_start._M_cur !=
        local_118._M_impl.super__Deque_impl_data._M_finish._M_cur) {
      local_68 = local_118._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_60 = local_118._M_impl.super__Deque_impl_data._M_start._M_first;
      local_58 = local_118._M_impl.super__Deque_impl_data._M_start._M_last;
      local_50 = local_118._M_impl.super__Deque_impl_data._M_start._M_node;
      local_88 = local_118._M_impl.super__Deque_impl_data._M_finish._M_cur;
      local_80 = local_118._M_impl.super__Deque_impl_data._M_finish._M_first;
      local_78 = local_118._M_impl.super__Deque_impl_data._M_finish._M_last;
      local_70 = local_118._M_impl.super__Deque_impl_data._M_finish._M_node;
      uVar9 = ((long)local_118._M_impl.super__Deque_impl_data._M_start._M_last -
               (long)local_118._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
              ((long)local_118._M_impl.super__Deque_impl_data._M_finish._M_cur -
               (long)local_118._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
              ((((ulong)((long)local_118._M_impl.super__Deque_impl_data._M_finish._M_node -
                        (long)local_118._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1)
              + (ulong)(local_118._M_impl.super__Deque_impl_data._M_finish._M_node ==
                       (_Map_pointer)0x0)) * 0x40;
      lVar2 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<std::_Deque_iterator<std::chrono::duration<long,std::ratio<1l,1l>>,std::chrono::duration<long,std::ratio<1l,1l>>&,std::chrono::duration<long,std::ratio<1l,1l>>*>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (&local_68,&local_88,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
      local_a8 = pdVar3;
      local_a0 = pdVar4;
      local_98 = pdVar5;
      local_90 = ppdVar1;
      local_c8 = pdVar6;
      local_c0 = pdVar7;
      local_b8 = local_118._M_impl.super__Deque_impl_data._M_finish._M_last;
      local_b0 = ppdVar8;
      std::
      __final_insertion_sort<std::_Deque_iterator<std::chrono::duration<long,std::ratio<1l,1l>>,std::chrono::duration<long,std::ratio<1l,1l>>&,std::chrono::duration<long,std::ratio<1l,1l>>*>,__gnu_cxx::__ops::_Iter_less_iter>
                ();
    }
    uVar11 = ((long)local_118._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)local_118._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
             ((long)local_118._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)local_118._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
             ((((ulong)((long)local_118._M_impl.super__Deque_impl_data._M_finish._M_node -
                       (long)local_118._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (ulong)(local_118._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0
                    )) * 0x40 >> 1;
    uVar9 = ((long)local_118._M_impl.super__Deque_impl_data._M_start._M_cur -
             (long)local_118._M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar11;
    if (uVar9 < 0x40) {
      local_118._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_118._M_impl.super__Deque_impl_data._M_start._M_cur + uVar11;
    }
    else {
      uVar11 = uVar9 >> 6 | 0xfc00000000000000;
      if (0 < (long)uVar9) {
        uVar11 = uVar9 >> 6;
      }
      local_118._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_118._M_impl.super__Deque_impl_data._M_start._M_node[uVar11] +
           uVar9 + uVar11 * -0x40;
    }
    rVar10 = (local_118._M_impl.super__Deque_impl_data._M_start._M_cur)->__r;
    std::
    _Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~_Deque_base(&local_118);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (seconds)rVar10;
  }
  __stack_chk_fail();
}

Assistant:

std::chrono::seconds TimeOffsets::Median() const
{
    LOCK(m_mutex);

    // Only calculate the median if we have 5 or more offsets
    if (m_offsets.size() < 5) return 0s;

    auto sorted_copy = m_offsets;
    std::sort(sorted_copy.begin(), sorted_copy.end());
    return sorted_copy[sorted_copy.size() / 2];  // approximate median is good enough, keep it simple
}